

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmp.cpp
# Opt level: O0

void save_component_to_files
               (TRIPLEBYTES **mrx,BITMAPFILEHEADER bmFile,BITMAPINFOHEADER bmInfo,int component,
               char *filename)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  BITMAPINFOHEADER bmInfo_00;
  BITMAPFILEHEADER bmFile_00;
  u_char uVar3;
  ulong uVar4;
  TRIPLERGB *pTVar5;
  int local_84;
  undefined4 uStack_80;
  int i_1;
  undefined8 uStack_78;
  undefined8 local_70;
  undefined8 uStack_68;
  undefined8 local_60;
  TRIPLEBYTES **local_58;
  BITMAPFILEHEADER local_50;
  int j;
  int i;
  TRIPLERGB **mrxComponent;
  int width;
  int height;
  char *filename_local;
  TRIPLEBYTES **ppTStack_20;
  int component_local;
  TRIPLEBYTES **mrx_local;
  BITMAPFILEHEADER bmFile_local;
  
  bmFile_local._0_8_ = bmFile._8_8_;
  mrx_local = bmFile._0_8_;
  mrxComponent._4_4_ = bmInfo.biHeight;
  mrxComponent._0_4_ = bmInfo.biWidth;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (long)(int)bmInfo.biHeight;
  uVar4 = SUB168(auVar1 * ZEXT816(8),0);
  if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
    uVar4 = 0xffffffffffffffff;
  }
  _width = filename;
  filename_local._4_4_ = component;
  ppTStack_20 = mrx;
  _j = (TRIPLERGB **)operator_new__(uVar4);
  for (local_50.bfOffBits = 0; (int)local_50.bfOffBits < (int)mrxComponent._4_4_;
      local_50.bfOffBits = local_50.bfOffBits + 1) {
    auVar2._8_8_ = 0;
    auVar2._0_8_ = (long)(int)(uint)mrxComponent;
    uVar4 = SUB168(auVar2 * ZEXT816(3),0);
    if (SUB168(auVar2 * ZEXT816(3),8) != 0) {
      uVar4 = 0xffffffffffffffff;
    }
    pTVar5 = (TRIPLERGB *)operator_new__(uVar4);
    _j[(int)local_50.bfOffBits] = pTVar5;
    local_50.bfReserved1 = 0;
    local_50.bfReserved2 = 0;
    for (; (int)local_50._8_4_ < (int)(uint)mrxComponent; local_50._8_4_ = local_50._8_4_ + 1) {
      uVar3 = getComponent(ppTStack_20,local_50.bfOffBits,local_50._8_4_,filename_local._4_4_);
      _j[(int)local_50.bfOffBits][(int)local_50._8_4_].blue = uVar3;
      _j[(int)local_50.bfOffBits][(int)local_50._8_4_].green = uVar3;
      _j[(int)local_50.bfOffBits][(int)local_50._8_4_].red = uVar3;
    }
  }
  local_58 = mrx_local;
  local_50.bfType = bmFile_local.bfType;
  local_50._2_2_ = bmFile_local._2_2_;
  local_50.bfSize = bmFile_local.bfSize;
  memcpy(&stack0xffffffffffffff80,&bmInfo,0x28);
  bmFile_00.bfReserved1 = local_50.bfType;
  bmFile_00.bfReserved2 = local_50._2_2_;
  bmFile_00.bfOffBits = local_50.bfSize;
  bmFile_00._0_8_ = local_58;
  bmInfo_00.biHeight = (undefined4)uStack_78;
  bmInfo_00.biPlanes = uStack_78._4_2_;
  bmInfo_00.biBitCount = uStack_78._6_2_;
  bmInfo_00.biSize = uStack_80;
  bmInfo_00.biWidth = i_1;
  bmInfo_00.biCompression = (undefined4)local_70;
  bmInfo_00.biSizeImage = local_70._4_4_;
  bmInfo_00.biXPelsPerMeter = (undefined4)uStack_68;
  bmInfo_00.biYPelsPerMeter = uStack_68._4_4_;
  bmInfo_00.biClrUsed = (undefined4)local_60;
  bmInfo_00.biClrImportant = local_60._4_4_;
  saveBMPFile(bmFile_00,bmInfo_00,_j,_width);
  for (local_84 = 0; local_84 < (int)mrxComponent._4_4_; local_84 = local_84 + 1) {
    if (_j[local_84] != (TRIPLERGB *)0x0) {
      operator_delete__(_j[local_84]);
    }
  }
  if (_j != (TRIPLERGB **)0x0) {
    operator_delete__(_j);
  }
  return;
}

Assistant:

void save_component_to_files(TRIPLEBYTES **mrx, BITMAPFILEHEADER bmFile, BITMAPINFOHEADER bmInfo, int component,
                             const char *filename) {
    int height = bmInfo.biHeight;
    int width = bmInfo.biWidth;
    TRIPLERGB **mrxComponent = new TRIPLERGB *[height];
    for (int i = 0; i < height; i++) {
        mrxComponent[i] = new TRIPLERGB[width];
        for (int j = 0; j < width; j++) {
            mrxComponent[i][j].red = mrxComponent[i][j].green = mrxComponent[i][j].blue = getComponent(mrx, i, j,
                                                                                                       component);
        }
    }
    saveBMPFile(bmFile, bmInfo, mrxComponent, filename);
    for (int i = 0; i < height; i++) {
        delete[] mrxComponent[i];
    }
    delete[] mrxComponent;
}